

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O2

void outputHandleDone(void *userData,wl_output *output)

{
  _GLFWmonitor **pp_Var1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  if ((*(int *)((long)userData + 0x88) < 1) || (*(int *)((long)userData + 0x8c) < 1)) {
    uVar2 = *(undefined8 *)
             (*(long *)((long)userData + 0x98) + (long)*(int *)((long)userData + 0x10c) * 0x18);
    auVar5._0_4_ = (float)(int)uVar2 * 25.4;
    auVar5._4_4_ = (float)(int)((ulong)uVar2 >> 0x20) * 25.4;
    auVar5._8_8_ = 0;
    auVar5 = divps(auVar5,_DAT_00148fd0);
    *(ulong *)((long)userData + 0x88) = CONCAT44((int)auVar5._4_4_,(int)auVar5._0_4_);
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)_glfw.monitorCount;
  if (_glfw.monitorCount < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      _glfwInputMonitor((_GLFWmonitor *)userData,0x40001,1);
      return;
    }
    pp_Var1 = _glfw.monitors + uVar4;
    uVar4 = uVar4 + 1;
  } while (*pp_Var1 != (_GLFWmonitor *)userData);
  return;
}

Assistant:

static void outputHandleDone(void* userData, struct wl_output* output)
{
    struct _GLFWmonitor* monitor = userData;

    if (monitor->widthMM <= 0 || monitor->heightMM <= 0)
    {
        // If Wayland does not provide a physical size, assume the default 96 DPI
        const GLFWvidmode* mode = &monitor->modes[monitor->wl.currentMode];
        monitor->widthMM  = (int) (mode->width * 25.4f / 96.f);
        monitor->heightMM = (int) (mode->height * 25.4f / 96.f);
    }

    for (int i = 0; i < _glfw.monitorCount; i++)
    {
        if (_glfw.monitors[i] == monitor)
            return;
    }

    _glfwInputMonitor(monitor, GLFW_CONNECTED, _GLFW_INSERT_LAST);
}